

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall ipx::IPM::Predictor(IPM *this,Step *step)

{
  Iterate *pIVar1;
  Iterate *pIVar2;
  double *rb;
  double *rc;
  double *rl;
  Vector *pVVar3;
  Int j;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  double dVar6;
  Vector su;
  Vector sl;
  
  pIVar1 = this->iterate_;
  __n = (long)pIVar1->model_->num_cols_ + (long)pIVar1->model_->num_rows_;
  std::valarray<double>::valarray(&sl,__n);
  pIVar2 = this->iterate_;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)__n) {
    uVar5 = __n & 0xffffffff;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dVar6 = 0.0;
    if (((pIVar2->variable_state_).
         super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar4] & ~BARRIER_BOXED) == BARRIER_LB) {
      dVar6 = -(pIVar1->xl_)._M_data[uVar4] * (pIVar1->zl_)._M_data[uVar4];
    }
    sl._M_data[uVar4] = dVar6;
  }
  std::valarray<double>::valarray(&su,__n);
  pIVar2 = this->iterate_;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dVar6 = 0.0;
    if ((pIVar2->variable_state_).
        super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4] - BARRIER_UB < 2) {
      dVar6 = -(pIVar1->xu_)._M_data[uVar4] * (pIVar1->zu_)._M_data[uVar4];
    }
    su._M_data[uVar4] = dVar6;
  }
  pVVar3 = Iterate::rb(this->iterate_);
  rb = pVVar3->_M_data;
  pVVar3 = Iterate::rc(this->iterate_);
  rc = pVVar3->_M_data;
  pVVar3 = Iterate::rl(this->iterate_);
  rl = pVVar3->_M_data;
  pVVar3 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,rb,rc,rl,pVVar3->_M_data,sl._M_data,su._M_data,step);
  operator_delete(su._M_data);
  operator_delete(sl._M_data);
  return;
}

Assistant:

void IPM::Predictor(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();

    // sl = -xl.*zl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}